

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

int b_array::first_ge<Map::Pair<std::__cxx11::string,unsigned_long>>
              (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
               *data,size_t size,
              Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *entry)

{
  bool bVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *__lhs;
  int iVar2;
  size_t i;
  ulong index;
  
  for (index = 0; size != index; index = index + 1) {
    __lhs = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            ::operator[](data,index);
    bVar1 = std::operator>=(&__lhs->key,&entry->key);
    if (bVar1) break;
  }
  iVar2 = (int)size;
  if (index < size) {
    iVar2 = (int)index;
  }
  return iVar2;
}

Assistant:

int first_ge(const b_array::Array<T>& data, size_t size, const T& entry) {
    for (size_t i = 0; i < size; i++) {
        if (data[i] >= entry) {
            return i;
        }
    }
    return size;
}